

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::udp_tracker_connection::on_scrape_response
          (udp_tracker_connection *this,span<const_char> buf)

{
  uint uVar1;
  long lVar2;
  uint ret;
  uint uVar3;
  char *pcVar4;
  int ret_2;
  uint uVar5;
  int ret_3;
  uint uVar6;
  int ret_1;
  uint uVar7;
  shared_ptr<libtorrent::aux::request_callback> cb;
  undefined1 local_60 [32];
  error_code local_40;
  
  pcVar4 = buf.m_ptr;
  timeout_handler::restart_read_timeout((timeout_handler *)this);
  uVar3 = 0;
  lVar2 = 0;
  do {
    uVar3 = uVar3 << 8 | (uint)(byte)pcVar4[lVar2 + 4];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  uVar1 = this->m_transaction_id;
  if (uVar3 == uVar1) {
    if (pcVar4[3] == '\x02') {
      if (0x13 < buf.m_len) {
        uVar7 = 0;
        lVar2 = 0;
        do {
          uVar7 = uVar7 << 8 | (uint)(byte)(pcVar4 + 8)[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        uVar5 = 0;
        lVar2 = 0;
        do {
          uVar5 = uVar5 << 8 | (uint)(byte)pcVar4[lVar2 + 0xc];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        uVar6 = 0;
        lVar2 = 0;
        do {
          uVar6 = uVar6 << 8 | (uint)(byte)pcVar4[lVar2 + 0x10];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        tracker_connection::requester((tracker_connection *)local_60);
        if ((_func_int **)local_60._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_60._0_8_ + 0x18))
                    (local_60._0_8_,&(this->super_tracker_connection).m_req,uVar7,uVar6,uVar5,
                     0xffffffff);
        }
        (*(this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[4])(this);
        if ((element_type *)local_60._8_8_ != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
        }
        goto LAB_0037e9ee;
      }
      local_60._0_16_ = (undefined1  [16])errors::make_error_code(invalid_tracker_response_length);
    }
    else {
      if (pcVar4[3] == '\x03') {
        local_40 = errors::make_error_code(tracker_failure);
        local_60._0_8_ = local_60 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,pcVar4 + 8,pcVar4 + buf.m_len);
        fail(this,&local_40,bittorrent,(char *)local_60._0_8_,(seconds32)0x0,(seconds32)0x1e);
        if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
          operator_delete((void *)local_60._0_8_,(ulong)((long)(_func_int ***)local_60._16_8_ + 1));
        }
        goto LAB_0037e9ee;
      }
      local_60._0_16_ = (undefined1  [16])errors::make_error_code(invalid_tracker_action);
    }
  }
  else {
    local_60._0_16_ = (undefined1  [16])errors::make_error_code(invalid_tracker_transaction_id);
  }
  fail(this,(error_code *)local_60,bittorrent,"",(seconds32)0x0,(seconds32)0x1e);
LAB_0037e9ee:
  return uVar3 == uVar1;
}

Assistant:

bool udp_tracker_connection::on_scrape_response(span<char const> buf)
	{
		restart_read_timeout();
		auto const action = static_cast<action_t>(aux::read_int32(buf));
		std::uint32_t const transaction = aux::read_uint32(buf);

		if (transaction != m_transaction_id)
		{
			fail(error_code(errors::invalid_tracker_transaction_id), operation_t::bittorrent);
			return false;
		}

		if (action == action_t::error)
		{
			fail(error_code(errors::tracker_failure), operation_t::bittorrent
				, std::string(buf.data(), static_cast<std::size_t>(buf.size())).c_str());
			return true;
		}

		if (action != action_t::scrape)
		{
			fail(error_code(errors::invalid_tracker_action), operation_t::bittorrent);
			return true;
		}

		if (buf.size() < 12)
		{
			fail(error_code(errors::invalid_tracker_response_length), operation_t::bittorrent);
			return true;
		}

		int const complete = aux::read_int32(buf);
		int const downloaded = aux::read_int32(buf);
		int const incomplete = aux::read_int32(buf);

		std::shared_ptr<request_callback> cb = requester();
		if (!cb)
		{
			close();
			return true;
		}

		cb->tracker_scrape_response(tracker_req()
			, complete, incomplete, downloaded, -1);

		close();
		return true;
	}